

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_MaskedBits16Bit_Test::TEST_SimpleString_MaskedBits16Bit_Test
          (TEST_SimpleString_MaskedBits16Bit_Test *this)

{
  TEST_SimpleString_MaskedBits16Bit_Test *this_local;
  
  memset(this,0,0x38);
  TEST_GROUP_CppUTestGroupSimpleString::TEST_GROUP_CppUTestGroupSimpleString
            (&this->super_TEST_GROUP_CppUTestGroupSimpleString);
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_SimpleString_MaskedBits16Bit_Test_003eaad8;
  return;
}

Assistant:

TEST(SimpleString, MaskedBits16Bit)
{
    STRCMP_EQUAL("xxxxxxxx xxxxxxxx", StringFromMaskedBits(0x0000, 0x0000, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("00000000 00000000", StringFromMaskedBits(0x0000, 0xFFFF, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("11111111 11111111", StringFromMaskedBits(0xFFFF, 0xFFFF, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("1xxxxxxx xxxxxxxx", StringFromMaskedBits(0x8000, 0x8000, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("xxxxxxxx xxxxxxx1", StringFromMaskedBits(0x0001, 0x0001, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("11xx11xx 11xx11xx", StringFromMaskedBits(0xFFFF, 0xCCCC, 2*8/CPPUTEST_CHAR_BIT).asCharString());
}